

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O2

TA_RetCode
TA_SetInputParamPricePtr
          (TA_ParamHolder *param,uint paramIndex,TA_Real *open,TA_Real *high,TA_Real *low,
          TA_Real *close,TA_Real *volume,TA_Real *openInterest)

{
  int *piVar1;
  int *piVar2;
  byte bVar3;
  TA_RetCode TVar4;
  uint uVar5;
  long lVar6;
  
  TVar4 = TA_BAD_PARAM;
  if (param != (TA_ParamHolder *)0x0) {
    piVar1 = (int *)param->hiddenData;
    if (*piVar1 == -0x5dfd4dfe) {
      if (*(long *)(piVar1 + 10) == 0) {
        TVar4 = TA_INVALID_HANDLE;
      }
      else {
        TVar4 = TA_BAD_PARAM;
        if (paramIndex < *(uint *)(*(long *)(piVar1 + 10) + 0x24)) {
          lVar6 = (ulong)paramIndex * 0x38;
          piVar2 = *(int **)(*(long *)(piVar1 + 2) + 0x30 + lVar6);
          if (piVar2 == (int *)0x0) {
            TVar4 = TA_INTERNAL_ERROR|TA_BAD_PARAM;
          }
          else if (*piVar2 == 0) {
            uVar5 = piVar2[4];
            if ((uVar5 & 1) != 0) {
              if (open == (TA_Real *)0x0) {
                return TA_BAD_PARAM;
              }
              *(TA_Real **)(*(long *)(piVar1 + 2) + lVar6) = open;
              uVar5 = piVar2[4];
            }
            if ((uVar5 & 2) != 0) {
              if (high == (TA_Real *)0x0) {
                return TA_BAD_PARAM;
              }
              *(TA_Real **)(*(long *)(piVar1 + 2) + 8 + lVar6) = high;
              uVar5 = piVar2[4];
            }
            if ((uVar5 & 4) != 0) {
              if (low == (TA_Real *)0x0) {
                return TA_BAD_PARAM;
              }
              *(TA_Real **)(*(long *)(piVar1 + 2) + 0x10 + lVar6) = low;
              uVar5 = piVar2[4];
            }
            if ((uVar5 & 8) != 0) {
              if (close == (TA_Real *)0x0) {
                return TA_BAD_PARAM;
              }
              *(TA_Real **)(*(long *)(piVar1 + 2) + 0x18 + lVar6) = close;
              uVar5 = piVar2[4];
            }
            if ((uVar5 & 0x10) != 0) {
              if (volume == (TA_Real *)0x0) {
                return TA_BAD_PARAM;
              }
              *(TA_Real **)(*(long *)(piVar1 + 2) + 0x20 + lVar6) = volume;
              uVar5 = piVar2[4];
            }
            if ((uVar5 & 0x20) != 0) {
              if (openInterest == (TA_Real *)0x0) {
                return TA_BAD_PARAM;
              }
              *(TA_Real **)(*(long *)(piVar1 + 2) + 0x28 + lVar6) = openInterest;
            }
            bVar3 = (byte)paramIndex & 0x1f;
            piVar1[8] = piVar1[8] & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
            TVar4 = TA_SUCCESS;
          }
          else {
            TVar4 = TA_INVALID_PARAM_HOLDER_TYPE;
          }
        }
      }
    }
    else {
      TVar4 = TA_INVALID_PARAM_HOLDER;
    }
  }
  return TVar4;
}

Assistant:

TA_RetCode TA_SetInputParamPricePtr( TA_ParamHolder     *param,
                                     unsigned int        paramIndex,
                                     const TA_Real      *open,
                                     const TA_Real      *high,
                                     const TA_Real      *low,
                                     const TA_Real      *close,
                                     const TA_Real      *volume,
                                     const TA_Real      *openInterest )
{

   TA_ParamHolderPriv *paramHolderPriv;
   const TA_InputParameterInfo *paramInfo;
   const TA_FuncInfo *funcInfo;

   if( param == NULL )
   {
      return TA_BAD_PARAM;
   }

   paramHolderPriv = (TA_ParamHolderPriv *)(param->hiddenData);
   if( paramHolderPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   /* Make sure this index really exist. */
   funcInfo = paramHolderPriv->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;
   if( paramIndex >= funcInfo->nbInput )
   {
      return TA_BAD_PARAM;
   }

   /* Verify the type of the parameter. */
   paramInfo = paramHolderPriv->in[paramIndex].inputInfo;
   if( !paramInfo ) return TA_INTERNAL_ERROR(2);
   if( paramInfo->type != TA_Input_Price )
   {
      return TA_INVALID_PARAM_HOLDER_TYPE;
   }

   /* keep a copy of the provided parameter. */
   #define SET_PARAM_INFO(lowerParam,upperParam) \
   { \
      if( paramInfo->flags & TA_IN_PRICE_##upperParam ) \
      { \
         if( lowerParam == NULL ) \
         { \
            return TA_BAD_PARAM; \
         } \
         paramHolderPriv->in[paramIndex].data.inPrice.lowerParam = lowerParam; \
      } \
   }

   SET_PARAM_INFO(open, OPEN );
   SET_PARAM_INFO(high, HIGH );
   SET_PARAM_INFO(low, LOW );
   SET_PARAM_INFO(close, CLOSE );
   SET_PARAM_INFO(volume, VOLUME );
   SET_PARAM_INFO(openInterest, OPENINTEREST );

   #undef SET_PARAM_INFO

   /* This parameter is now initialized, clear the corresponding bit. */
   paramHolderPriv->inBitmap &= ~(1<<paramIndex);

   return TA_SUCCESS;
}